

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicScalableKReach.cpp
# Opt level: O2

void __thiscall
DynamicScalableKReach::DynamicPartialIndex::update_insert
          (DynamicPartialIndex *this,vertex_t v,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *out,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *in,
          vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          *graph,vector<unsigned_char,_std::allocator<unsigned_char>_> *dist)

{
  byte bVar1;
  byte bVar2;
  value_type vVar3;
  uint *puVar4;
  byte *pbVar5;
  reference pvVar6;
  uint *s;
  uint *puVar7;
  ulong __n;
  uint *t;
  
  __n = (ulong)v;
  pbVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(dist,__n);
  bVar1 = *pbVar5;
  puVar4 = (in->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (puVar7 = (in->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start; puVar7 != puVar4; puVar7 = puVar7 + 1) {
    pbVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(dist,(ulong)*puVar7);
    if (*pbVar5 < this->k_) {
      pbVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(dist,(ulong)*puVar7);
      bVar2 = *pbVar5;
      pbVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(dist,__n);
      if (bVar2 + 1 < (uint)*pbVar5) {
        pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(dist,(ulong)*puVar7)
        ;
        vVar3 = *pvVar6;
        pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(dist,__n);
        *pvVar6 = vVar3 + '\x01';
      }
    }
  }
  pbVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(dist,__n);
  if (*pbVar5 < this->k_) {
    pbVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(dist,__n);
    if (*pbVar5 < bVar1) {
      resume_bfs(this,v,graph,dist);
      return;
    }
    puVar4 = (out->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    for (puVar7 = (out->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  super__Vector_impl_data._M_start; puVar7 != puVar4; puVar7 = puVar7 + 1) {
      pbVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(dist,__n);
      bVar1 = *pbVar5;
      pbVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(dist,(ulong)*puVar7);
      if (bVar1 + 1 < (uint)*pbVar5) {
        pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(dist,__n);
        vVar3 = *pvVar6;
        pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(dist,(ulong)*puVar7)
        ;
        *pvVar6 = vVar3 + '\x01';
        resume_bfs(this,*puVar7,graph,dist);
      }
    }
  }
  return;
}

Assistant:

void DynamicScalableKReach::DynamicPartialIndex::update_insert(vertex_t v, const std::vector<vertex_t> &out,
                                                               const std::vector<vertex_t> &in,
                                                               const std::vector<std::vector<vertex_t>> &graph,
                                                               std::vector<distance_t> &dist) {
    auto d = dist.at(v);
    for (const auto &s : in){
        if (dist.at(s) < k_ && dist.at(s) + 1 < dist.at(v)){
            dist.at(v) = dist.at(s) + 1;
        }
    }

    if (dist.at(v) >= k_){
        return;
    }

    if (dist.at(v) < d){
        resume_bfs(v, graph, dist);
    }
    else {
        for (const auto &t : out) {
            if (dist.at(v) + 1 < dist.at(t)){
                dist.at(t) = dist.at(v) + 1;
                resume_bfs(t, graph, dist);
            }
        }
    }
}